

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::DeferredTypeHandlerBase::ConvertFunction
          (DeferredTypeHandlerBase *this,JavascriptFunction *instance,
          DynamicTypeHandler *typeHandler)

{
  byte bVar1;
  ScriptContext *scriptContext;
  FunctionInfo *pFVar2;
  RecyclableObject *value;
  long *plVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined4 *puVar8;
  FunctionProxy *this_00;
  ScriptFunctionType *pSVar9;
  ScriptFunction *this_01;
  ParseableFunctionInfo *pPVar10;
  ScriptFunctionType *pSVar11;
  byte bVar12;
  int index;
  
  if (*(DeferredTypeHandlerBase **)
       ((instance->super_DynamicObject).super_RecyclableObject.type.ptr + 1) != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0xd,"(instance->GetDynamicType()->GetTypeHandler() == this)",
                                "instance->GetDynamicType()->GetTypeHandler() == this");
    if (!bVar5) goto LAB_00da58aa;
    *puVar8 = 0;
  }
  if ((this->super_DynamicTypeHandler).inlineSlotCapacity != typeHandler->inlineSlotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0xe,"(this->inlineSlotCapacity == typeHandler->inlineSlotCapacity)"
                                ,"this->inlineSlotCapacity == typeHandler->inlineSlotCapacity");
    if (!bVar5) goto LAB_00da58aa;
    *puVar8 = 0;
  }
  if ((this->super_DynamicTypeHandler).offsetOfInlineSlots != typeHandler->offsetOfInlineSlots) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0xf,
                                "(this->offsetOfInlineSlots == typeHandler->offsetOfInlineSlots)",
                                "this->offsetOfInlineSlots == typeHandler->offsetOfInlineSlots");
    if (!bVar5) goto LAB_00da58aa;
    *puVar8 = 0;
  }
  if (((this->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6 !=
      (typeHandler->propertyTypes & 0x40) >> 6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0x10,
                                "(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked())"
                                ,
                                "this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked()"
                               );
    if (!bVar5) goto LAB_00da58aa;
    *puVar8 = 0;
  }
  bVar1 = (this->super_DynamicTypeHandler).flags;
  bVar5 = CrossSite::IsThunk((JavascriptMethod)
                             ((instance->super_DynamicObject).super_RecyclableObject.type.ptr)->
                             entryPoint);
  scriptContext =
       (((((instance->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
       ->super_JavascriptLibraryBase).scriptContext.ptr;
  pSVar9 = (ScriptFunctionType *)0x0;
  DynamicObject::EnsureSlots
            (&instance->super_DynamicObject,0,typeHandler->slotCapacity,scriptContext,typeHandler);
  this_00 = JavascriptFunction::GetFunctionProxy(instance);
  if (this_00 != (FunctionProxy *)0x0) {
    if (bVar5) {
      pSVar9 = FunctionProxy::GetCrossSiteUndeferredFunctionType(this_00);
    }
    else {
      pSVar9 = FunctionProxy::GetUndeferredFunctionType(this_00);
    }
  }
  bVar12 = (bVar1 & 0x20) >> 5;
  if ((pSVar9 == (ScriptFunctionType *)0x0 || bVar12 != 0) ||
     ((pSVar9->super_DynamicType).super_Type.prototype.ptr !=
      (((instance->super_DynamicObject).super_RecyclableObject.type.ptr)->prototype).ptr)) {
    DynamicTypeHandler::SetInstanceTypeHandler(typeHandler,&instance->super_DynamicObject,true);
    if ((bVar12 == 0 && this_00 != (FunctionProxy *)0x0) &&
       (((typeHandler->flags & 8) != 0 &&
        (bVar6 = Phases::IsEnabled((Phases *)&DAT_015bbe90,ShareFuncTypesPhase), !bVar6)))) {
      this_01 = UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>(instance);
      pSVar9 = ScriptFunction::GetScriptFunctionType(this_01);
      if (bVar5) {
        if ((this_00->functionInfo).ptr == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x537,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar5) goto LAB_00da58aa;
          *puVar8 = 0;
        }
        if ((((this_00->functionInfo).ptr)->functionBodyImpl).ptr != this_00) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x538,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                      "GetFunctionInfo()->GetFunctionProxy() == this");
          if (!bVar5) goto LAB_00da58aa;
          *puVar8 = 0;
        }
        pFVar2 = (this_00->functionInfo).ptr;
        if ((((pFVar2->functionBodyImpl).ptr != (FunctionProxy *)0x0) &&
            ((pFVar2->attributes & DeferredDeserialize) == None)) &&
           (pPVar10 = FunctionProxy::GetParseableFunctionInfo(this_00),
           (pPVar10->crossSiteUndeferredFunctionType).ptr == (ScriptFunctionType *)0x0)) {
          pPVar10 = FunctionProxy::GetParseableFunctionInfo(this_00);
          ParseableFunctionInfo::SetCrossSiteUndeferredFunctionType(pPVar10,pSVar9);
        }
      }
      else {
        pSVar11 = FunctionProxy::GetUndeferredFunctionType(this_00);
        if (pSVar11 == (ScriptFunctionType *)0x0) {
          FunctionProxy::SetUndeferredFunctionType(this_00,pSVar9);
        }
      }
      DynamicObject::ShareType(&instance->super_DynamicObject);
    }
  }
  else {
    if ((pSVar9->super_DynamicType).isShared == false) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                  ,0x27,"(undeferredFunctionType->GetIsShared())",
                                  "undeferredFunctionType->GetIsShared()");
      if (!bVar5) goto LAB_00da58aa;
      *puVar8 = 0;
    }
    DynamicObject::ReplaceType(&instance->super_DynamicObject,&pSVar9->super_DynamicType);
  }
  value = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase
          ).undefinedValue.ptr;
  iVar7 = (*typeHandler->_vptr_DynamicTypeHandler[6])(typeHandler);
  if (typeHandler->slotCapacity < iVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0x42,"(propertyCount <= typeHandler->GetSlotCapacity())",
                                "propertyCount <= typeHandler->GetSlotCapacity()");
    if (!bVar5) {
LAB_00da58aa:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  if (0 < iVar7) {
    index = 0;
    do {
      DynamicTypeHandler::SetSlotUnchecked(&instance->super_DynamicObject,index,value);
      index = index + 1;
    } while (iVar7 != index);
  }
  if ((bVar1 & 0x20) == 0) {
    return;
  }
  plVar3 = *(long **)((instance->super_DynamicObject).super_RecyclableObject.type.ptr + 1);
  (**(code **)(*plVar3 + 0x290))(plVar3,instance);
  return;
}

Assistant:

void DeferredTypeHandlerBase::ConvertFunction(JavascriptFunction * instance, DynamicTypeHandler * typeHandler)
    {
        Assert(instance->GetDynamicType()->GetTypeHandler() == this);
        Assert(this->inlineSlotCapacity == typeHandler->inlineSlotCapacity);
        Assert(this->offsetOfInlineSlots == typeHandler->offsetOfInlineSlots);
        Assert(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked());

        // Since the caller owns the typeHandler the instance is transitioning to, the caller should have
        // set up the singleton instance on that handler, if fixed fields are desired.  The caller is
        // also responsible for populating PropertyTypes to indicate whether there are any read-only
        // properties unknown to the type handler.

        bool isProto = this->GetIsPrototype();
        bool isCrossSite = CrossSite::IsThunk(instance->GetType()->GetEntryPoint()); 

        ScriptContext* scriptContext = instance->GetScriptContext();
        instance->EnsureSlots(0, typeHandler->GetSlotCapacity(), scriptContext, typeHandler);

        FunctionProxy * functionProxy = instance->GetFunctionProxy();

        ScriptFunctionType * undeferredFunctionType = nullptr;
        if (functionProxy)
        {
            undeferredFunctionType = isCrossSite ? functionProxy->GetCrossSiteUndeferredFunctionType() : functionProxy->GetUndeferredFunctionType();
        }

        if (undeferredFunctionType && !isProto && (undeferredFunctionType->GetPrototype() == instance->GetType()->GetPrototype()))
        {
            Assert(undeferredFunctionType->GetIsShared());
            instance->ReplaceType(undeferredFunctionType);
        }
        else
        {
            typeHandler->SetInstanceTypeHandler(instance);
            if (functionProxy && !isProto && typeHandler->GetMayBecomeShared() && !PHASE_OFF1(ShareFuncTypesPhase))
            {
                ScriptFunctionType *newType = UnsafeVarTo<ScriptFunction>(instance)->GetScriptFunctionType();
                if (isCrossSite)
                {
                    if (functionProxy->HasParseableInfo() && !functionProxy->GetParseableFunctionInfo()->GetCrossSiteUndeferredFunctionType())
                    {
                        functionProxy->GetParseableFunctionInfo()->SetCrossSiteUndeferredFunctionType(newType);
                    }
                }
                else if (!functionProxy->GetUndeferredFunctionType())
                {
                    functionProxy->SetUndeferredFunctionType(newType);
                }
                instance->ShareType();
            }
        }

        // We may be changing to a type handler that already has some properties. Initialize those to undefined.
        const Var undefined = scriptContext->GetLibrary()->GetUndefined();
        const BigPropertyIndex propertyCount = typeHandler->GetPropertyCount();
        Assert(propertyCount <= typeHandler->GetSlotCapacity());
        for(BigPropertyIndex i = 0; i < propertyCount; ++i)
        {
            typeHandler->SetSlotUnchecked(instance, i, undefined);
        }

        if (isProto)
        {
            instance->GetDynamicType()->GetTypeHandler()->SetIsPrototype(instance);
        }
    }